

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall cmMakefile::AddAlias(cmMakefile *this,string *lname,cmTarget *tgt)

{
  mapped_type *ppcVar1;
  cmGlobalGenerator *this_00;
  cmTarget *tgt_local;
  string *lname_local;
  cmMakefile *this_local;
  
  ppcVar1 = std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget_*>_>_>
            ::operator[](&this->AliasTargets,lname);
  *ppcVar1 = tgt;
  this_00 = GetGlobalGenerator(this);
  cmGlobalGenerator::AddAlias(this_00,lname,tgt);
  return;
}

Assistant:

void cmMakefile::AddAlias(const std::string& lname, cmTarget *tgt)
{
  this->AliasTargets[lname] = tgt;
  this->GetGlobalGenerator()->AddAlias(lname, tgt);
}